

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool duckdb::BitpackingAnalyze<unsigned_short>(AnalyzeState *state,Vector *input,idx_t count)

{
  BlockManager *pBVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_78;
  
  iVar2 = GetTypeIdSize((input->type).physical_type_);
  pBVar1 = (state->info).block_manager;
  iVar3 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar4 = optional_idx::GetIndex(&pBVar1->block_header_size);
  if (iVar3 - iVar4 < iVar2 << 0xc) {
    bVar8 = false;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    bVar8 = count == 0;
    if (!bVar8) {
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)(local_78.sel)->sel_vector[uVar6];
        }
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar7 = true;
        }
        else {
          bVar7 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0;
        }
        bVar7 = BitpackingState<unsigned_short,_short>::Update<duckdb::EmptyBitpackingWriter>
                          ((BitpackingState<unsigned_short,_short> *)(state + 1),
                           *(unsigned_short *)(local_78.data + uVar5 * 2),bVar7);
        if (!bVar7) break;
        uVar6 = uVar6 + 1;
        bVar8 = count <= uVar6;
      } while (uVar6 != count);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return bVar8;
}

Assistant:

bool BitpackingAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = state.Cast<BitpackingAnalyzeState<T>>();

	// We use BITPACKING_METADATA_GROUP_SIZE tuples, which can exceed the block size.
	// In that case, we disable bitpacking.
	// we are conservative here by multiplying by 2
	auto type_size = GetTypeIdSize(input.GetType().InternalType());
	if (type_size * BITPACKING_METADATA_GROUP_SIZE * 2 > state.info.GetBlockSize()) {
		return false;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!analyze_state.state.template Update<EmptyBitpackingWriter>(data[idx], vdata.validity.RowIsValid(idx))) {
			return false;
		}
	}
	return true;
}